

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendreCorrFunc.cpp
# Opt level: O0

void __thiscall
OpenMD::LegendreCorrFunc::LegendreCorrFunc
          (LegendreCorrFunc *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          int seleOffset,int order)

{
  ostream *poVar1;
  DoublePolynomial *pDVar2;
  allocator<char> *in_RDI;
  allocator<char> *__s;
  allocator<char> *__new_size;
  LegendrePolynomial *this_00;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  LegendrePolynomial polynomial;
  string paramString;
  stringstream params;
  string *in_stack_fffffffffffffd18;
  int n;
  TimeCorrFunc<OpenMD::Vector3<double>_> *in_stack_fffffffffffffd20;
  TimeCorrFunc<OpenMD::Vector3<double>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  string *in_stack_fffffffffffffd30;
  SimInfo *in_stack_fffffffffffffd38;
  ObjectACF<OpenMD::Vector3<double>_> *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  undefined1 local_271 [33];
  string local_250 [32];
  stringstream local_230 [16];
  ostream local_220 [376];
  string local_a8 [32];
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [96];
  
  local_60._52_4_ = in_R9D;
  ObjectACF<OpenMD::Vector3<double>_>::ObjectACF
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28,(string *)in_stack_fffffffffffffd20);
  *(undefined ***)in_RDI = &PTR__LegendreCorrFunc_004e2be0;
  *(undefined4 *)(in_RDI + 0xe40) = in_stack_00000008;
  __s = in_RDI + 0xe48;
  Polynomial<double>::Polynomial((Polynomial<double> *)0x16993d);
  __new_size = in_RDI + 0xe78;
  std::
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ::vector((vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
            *)0x169955);
  this_00 = (LegendrePolynomial *)(in_RDI + 0xe90);
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::vector((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
            *)0x16996b);
  in_RDI[0xea8] = (allocator<char>)0x1;
  *(undefined4 *)(in_RDI + 0xeac) = local_60._52_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffd60,(char *)__s,in_RDI);
  TimeCorrFunc<OpenMD::Vector3<double>_>::setCorrFuncType
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  getPrefix(in_stack_fffffffffffffd28);
  std::operator+(in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
  DynamicProperty::setOutputName
            (&in_stack_fffffffffffffd20->super_DynamicProperty,in_stack_fffffffffffffd18);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::stringstream::stringstream(local_230);
  poVar1 = std::operator<<(local_220," order = ");
  std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xe40));
  poVar1 = std::operator<<(local_220," seleoffset = ");
  std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xeac));
  std::__cxx11::stringstream::str();
  TimeCorrFunc<OpenMD::Vector3<double>_>::setParameterString
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  this_01 = (TimeCorrFunc<OpenMD::Vector3<double>_> *)local_271;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffd60,(char *)__s,in_RDI);
  TimeCorrFunc<OpenMD::Vector3<double>_>::setLabelString(this_01,in_stack_fffffffffffffd18);
  n = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  std::__cxx11::string::~string((string *)(local_271 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_271);
  LegendrePolynomial::LegendrePolynomial(this_00,(int)((ulong)__new_size >> 0x20));
  pDVar2 = LegendrePolynomial::getLegendrePolynomial((LegendrePolynomial *)this_01,n);
  Polynomial<double>::operator=((Polynomial<double> *)this_01,pDVar2);
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::resize((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
            *)this_00,(size_type)__new_size);
  LegendrePolynomial::~LegendrePolynomial((LegendrePolynomial *)0x169b95);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::stringstream::~stringstream(local_230);
  return;
}

Assistant:

LegendreCorrFunc::LegendreCorrFunc(SimInfo* info, const std::string& filename,
                                     const std::string& sele1,
                                     const std::string& sele2,
				     int seleOffset,
				     int order) :
    ObjectACF<Vector3d>(info, filename, sele1, sele2), doOffset_(true),
    seleOffset_(seleOffset), order_(order) {
    setCorrFuncType("Legendre Correlation Function");
    setOutputName(getPrefix(dumpFilename_) + ".lcorr");

    std::stringstream params;
    params << " order = " << order_;
    params << " seleoffset = " << seleOffset_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    setLabelString("Pn(costheta_x)\tPn(costheta_y)\tPn(costheta_z)");

    LegendrePolynomial polynomial(order);
    legendre_ = polynomial.getLegendrePolynomial(order);

    vectors_.resize(nFrames_);
  }